

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

void xmlRelaxNGCheckCombine(void *payload,void *data,xmlChar *name)

{
  int iVar1;
  int iVar2;
  xmlChar *str1;
  xmlRelaxNGDefinePtr_conflict payload_00;
  xmlRelaxNGDefinePtr pxVar3;
  xmlHashTablePtr pxVar4;
  char *msg;
  xmlRelaxNGDefinePtr *ppxVar5;
  xmlNodePtr node;
  xmlChar *str2;
  void *pvVar6;
  xmlRelaxNGDefinePtr pxVar7;
  bool bVar8;
  bool bVar9;
  char tmpname [32];
  xmlChar local_58 [40];
  
  if (*(long *)((long)payload + 0x58) != 0) {
    if (payload == (void *)0x0) {
      bVar8 = true;
    }
    else {
      iVar2 = -1;
      bVar8 = false;
      pvVar6 = payload;
      do {
        str1 = xmlGetProp(*(xmlNode **)((long)pvVar6 + 8),(xmlChar *)"combine");
        if (str1 == (xmlChar *)0x0) {
          if (bVar8) {
            xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x41e,
                       "Some defines for %s needs the combine attribute\n",name,(xmlChar *)0x0);
          }
          bVar8 = true;
        }
        else {
          iVar1 = xmlStrEqual(str1,(xmlChar *)"choice");
          if (iVar1 == 0) {
            iVar1 = xmlStrEqual(str1,(xmlChar *)"interleave");
            if (iVar1 == 0) {
              node = *(xmlNodePtr *)((long)payload + 8);
              iVar1 = 0x45a;
              msg = "Defines for %s use unknown combine value \'%s\'\'\n";
              str2 = str1;
              goto LAB_00188925;
            }
            bVar9 = iVar2 == 1;
            iVar2 = 0;
            if (bVar9) {
              xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x3f2,
                         "Defines for %s use both \'choice\' and \'interleave\'\n",name,
                         (xmlChar *)0x0);
              iVar2 = 1;
            }
          }
          else {
            bVar9 = iVar2 == 0;
            iVar2 = 1;
            if (bVar9) {
              node = *(xmlNodePtr *)((long)payload + 8);
              iVar2 = 0;
              iVar1 = 0x3f2;
              msg = "Defines for %s use both \'choice\' and \'interleave\'\n";
              str2 = (xmlChar *)0x0;
LAB_00188925:
              xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,node,iVar1,msg,name,str2);
            }
          }
          (*xmlFree)(str1);
        }
        pvVar6 = *(void **)((long)pvVar6 + 0x58);
      } while (pvVar6 != (void *)0x0);
      bVar8 = iVar2 + 1U < 2;
    }
    payload_00 = xmlRelaxNGNewDefine((xmlRelaxNGParserCtxtPtr)data,
                                     *(xmlNodePtr *)((long)payload + 8));
    if (payload_00 != (xmlRelaxNGDefinePtr_conflict)0x0) {
      payload_00->type = (uint)bVar8 * 2 + XML_RELAXNG_CHOICE;
      if (payload != (void *)0x0) {
        pxVar7 = (xmlRelaxNGDefinePtr)0x0;
        pvVar6 = payload;
        do {
          pxVar3 = *(xmlRelaxNGDefinePtr *)((long)pvVar6 + 0x30);
          if (pxVar3 != (xmlRelaxNGDefinePtr)0x0) {
            if (pxVar3->next != (xmlRelaxNGDefinePtr)0x0) {
              pxVar3 = xmlRelaxNGNewDefine((xmlRelaxNGParserCtxtPtr)data,pxVar3->node);
              if (pxVar3 == (xmlRelaxNGDefinePtr_conflict)0x0) break;
              pxVar3->type = XML_RELAXNG_GROUP;
              pxVar3->content = *(xmlRelaxNGDefinePtr *)((long)pvVar6 + 0x30);
            }
            ppxVar5 = &pxVar7->next;
            if (pxVar7 == (xmlRelaxNGDefinePtr)0x0) {
              ppxVar5 = &payload_00->content;
            }
            *ppxVar5 = pxVar3;
            pxVar7 = pxVar3;
          }
          *(xmlRelaxNGDefinePtr_conflict *)((long)pvVar6 + 0x30) = payload_00;
          pvVar6 = *(void **)((long)pvVar6 + 0x58);
        } while (pvVar6 != (void *)0x0);
      }
      *(xmlRelaxNGDefinePtr_conflict *)((long)payload + 0x30) = payload_00;
      if (bVar8 != false) {
        if (*(long *)((long)data + 0x68) == 0) {
          pxVar4 = xmlHashCreate(10);
          *(xmlHashTablePtr *)((long)data + 0x68) = pxVar4;
        }
        if (*(long *)((long)data + 0x68) == 0) {
          xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x416,
                     "Failed to create interleaves hash table\n",(xmlChar *)0x0,(xmlChar *)0x0);
          return;
        }
        *(int *)((long)data + 0x60) = *(int *)((long)data + 0x60) + 1;
        snprintf((char *)local_58,0x20,"interleave%d");
        iVar2 = xmlHashAddEntry(*(xmlHashTablePtr *)((long)data + 0x68),local_58,payload_00);
        if (iVar2 < 0) {
          xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x416,
                     "Failed to add %s to hash table\n",local_58,(xmlChar *)0x0);
        }
      }
    }
  }
  return;
}

Assistant:

static void
xmlRelaxNGCheckCombine(void *payload, void *data, const xmlChar * name)
{
    xmlRelaxNGDefinePtr define = (xmlRelaxNGDefinePtr) payload;
    xmlRelaxNGParserCtxtPtr ctxt = (xmlRelaxNGParserCtxtPtr) data;
    xmlChar *combine;
    int choiceOrInterleave = -1;
    int missing = 0;
    xmlRelaxNGDefinePtr cur, last, tmp, tmp2;

    if (define->nextHash == NULL)
        return;
    cur = define;
    while (cur != NULL) {
        combine = xmlGetProp(cur->node, BAD_CAST "combine");
        if (combine != NULL) {
            if (xmlStrEqual(combine, BAD_CAST "choice")) {
                if (choiceOrInterleave == -1)
                    choiceOrInterleave = 1;
                else if (choiceOrInterleave == 0) {
                    xmlRngPErr(ctxt, define->node, XML_RNGP_DEF_CHOICE_AND_INTERLEAVE,
                               "Defines for %s use both 'choice' and 'interleave'\n",
                               name, NULL);
                }
            } else if (xmlStrEqual(combine, BAD_CAST "interleave")) {
                if (choiceOrInterleave == -1)
                    choiceOrInterleave = 0;
                else if (choiceOrInterleave == 1) {
                    xmlRngPErr(ctxt, define->node, XML_RNGP_DEF_CHOICE_AND_INTERLEAVE,
                               "Defines for %s use both 'choice' and 'interleave'\n",
                               name, NULL);
                }
            } else {
                xmlRngPErr(ctxt, define->node, XML_RNGP_UNKNOWN_COMBINE,
                           "Defines for %s use unknown combine value '%s''\n",
                           name, combine);
            }
            xmlFree(combine);
        } else {
            if (missing == 0)
                missing = 1;
            else {
                xmlRngPErr(ctxt, define->node, XML_RNGP_NEED_COMBINE,
                           "Some defines for %s needs the combine attribute\n",
                           name, NULL);
            }
        }

        cur = cur->nextHash;
    }
    if (choiceOrInterleave == -1)
        choiceOrInterleave = 0;
    cur = xmlRelaxNGNewDefine(ctxt, define->node);
    if (cur == NULL)
        return;
    if (choiceOrInterleave == 0)
        cur->type = XML_RELAXNG_INTERLEAVE;
    else
        cur->type = XML_RELAXNG_CHOICE;
    tmp = define;
    last = NULL;
    while (tmp != NULL) {
        if (tmp->content != NULL) {
            if (tmp->content->next != NULL) {
                /*
                 * we need first to create a wrapper.
                 */
                tmp2 = xmlRelaxNGNewDefine(ctxt, tmp->content->node);
                if (tmp2 == NULL)
                    break;
                tmp2->type = XML_RELAXNG_GROUP;
                tmp2->content = tmp->content;
            } else {
                tmp2 = tmp->content;
            }
            if (last == NULL) {
                cur->content = tmp2;
            } else {
                last->next = tmp2;
            }
            last = tmp2;
        }
        tmp->content = cur;
        tmp = tmp->nextHash;
    }
    define->content = cur;
    if (choiceOrInterleave == 0) {
        if (ctxt->interleaves == NULL)
            ctxt->interleaves = xmlHashCreate(10);
        if (ctxt->interleaves == NULL) {
            xmlRngPErr(ctxt, define->node, XML_RNGP_INTERLEAVE_CREATE_FAILED,
                       "Failed to create interleaves hash table\n", NULL,
                       NULL);
        } else {
            char tmpname[32];

            snprintf(tmpname, 32, "interleave%d", ctxt->nbInterleaves++);
            if (xmlHashAddEntry(ctxt->interleaves, BAD_CAST tmpname, cur) <
                0) {
                xmlRngPErr(ctxt, define->node, XML_RNGP_INTERLEAVE_CREATE_FAILED,
                           "Failed to add %s to hash table\n",
			   (const xmlChar *) tmpname, NULL);
            }
        }
    }
}